

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O2

IVec4 __thiscall tcu::getTextureBorderColorInt(tcu *this,TextureFormat *format,Sampler *sampler)

{
  ChannelType channelType;
  uint uVar1;
  TextureSwizzle *pTVar2;
  uint uVar3;
  uint uVar4;
  ulong extraout_RDX;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  int c;
  long lVar8;
  IVec4 IVar9;
  IVec4 valueMax;
  IVec4 valueMin;
  IVec4 channelBits;
  
  channelType = format->type;
  pTVar2 = getBorderColorReadSwizzle(format->order);
  getChannelBitDepth((tcu *)&channelBits,channelType);
  uVar3 = -1 << ((char)channelBits.m_data[0] - 1U & 0x1f);
  uVar6 = -1 << ((char)channelBits.m_data[1] - 1U & 0x1f);
  uVar7 = -1 << ((char)channelBits.m_data[2] - 1U & 0x1f);
  uVar1 = -1 << ((char)channelBits.m_data[3] - 1U & 0x1f);
  valueMin.m_data[0] = 0x80000000;
  if ((uint)channelBits.m_data[0] < 0x20) {
    valueMin.m_data[0] = uVar3;
  }
  valueMax.m_data[0] = ~uVar3;
  if ((uint)channelBits.m_data[0] >= 0x20) {
    valueMax.m_data[0] = 0x7fffffff;
  }
  lVar8 = 0;
  uVar3 = 0;
  if (channelBits.m_data[0] < 1) {
    valueMin.m_data[0] = 0;
  }
  uVar4 = 0;
  if (channelBits.m_data[0] < 1) {
    valueMax.m_data[0] = uVar4;
  }
  valueMin.m_data[1] = 0x80000000;
  if ((uint)channelBits.m_data[1] < 0x20) {
    valueMin.m_data[1] = uVar6;
  }
  valueMax.m_data[1] = ~uVar6;
  if ((uint)channelBits.m_data[1] >= 0x20) {
    valueMax.m_data[1] = 0x7fffffff;
  }
  if (channelBits.m_data[1] < 1) {
    valueMax.m_data[1] = uVar4;
    valueMin.m_data[1] = uVar3;
  }
  valueMin.m_data[2] = 0x80000000;
  if ((uint)channelBits.m_data[2] < 0x20) {
    valueMin.m_data[2] = uVar7;
  }
  valueMax.m_data[2] = ~uVar7;
  if ((uint)channelBits.m_data[2] >= 0x20) {
    valueMax.m_data[2] = 0x7fffffff;
  }
  if (channelBits.m_data[2] < 1) {
    valueMax.m_data[2] = uVar3;
    valueMin.m_data[2] = uVar3;
  }
  valueMin.m_data[3] = 0x80000000;
  if ((uint)channelBits.m_data[3] < 0x20) {
    valueMin.m_data[3] = uVar1;
  }
  valueMax.m_data[3] = ~uVar1;
  if ((uint)channelBits.m_data[3] >= 0x20) {
    valueMax.m_data[3] = 0x7fffffff;
  }
  if (channelBits.m_data[3] < 1) {
    valueMax.m_data[3] = uVar4;
    valueMin.m_data[3] = uVar3;
  }
  Vector<int,_4>::Vector((Vector<int,_4> *)this);
  uVar5 = extraout_RDX;
  for (; lVar8 != 4; lVar8 = lVar8 + 1) {
    uVar5 = (ulong)(int)pTVar2->components[lVar8];
    if (uVar5 == 4) {
      uVar1 = 0;
    }
    else if (pTVar2->components[lVar8] == CHANNEL_ONE) {
      uVar1 = 1;
    }
    else {
      uVar3 = (sampler->borderColor).v.iData[uVar5];
      uVar1 = valueMax.m_data[uVar5];
      if ((int)uVar3 < valueMax.m_data[uVar5]) {
        uVar1 = uVar3;
      }
      uVar6 = valueMin.m_data[uVar5];
      uVar5 = (ulong)uVar6;
      if ((int)uVar3 < (int)uVar6) {
        uVar1 = uVar6;
      }
    }
    *(uint *)(this + lVar8 * 4) = uVar1;
  }
  IVar9.m_data[2] = (int)uVar5;
  IVar9.m_data[3] = (int)(uVar5 >> 0x20);
  IVar9.m_data._0_8_ = this;
  return (IVec4)IVar9.m_data;
}

Assistant:

static tcu::IVec4 getTextureBorderColorInt (const TextureFormat& format, const Sampler& sampler)
{
	const tcu::TextureChannelClass	channelClass	= getTextureChannelClass(format.type);
	const TextureSwizzle::Channel*	channelMap		= getBorderColorReadSwizzle(format.order).components;
	const IVec4						channelBits		= getChannelBitDepth(format.type);
	const IVec4						valueMin		= getNBitSignedIntegerVec4MinValue(channelBits);
	const IVec4						valueMax		= getNBitSignedIntegerVec4MaxValue(channelBits);
	IVec4							result;

	DE_ASSERT(channelClass == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER);
	DE_UNREF(channelClass);

	for (int c = 0; c < 4; c++)
	{
		const TextureSwizzle::Channel map = channelMap[c];
		if (map == TextureSwizzle::CHANNEL_ZERO)
			result[c] = 0;
		else if (map == TextureSwizzle::CHANNEL_ONE)
			result[c] = 1;
		else
		{
			// integer values are clamped to a representable range
			result[c] = de::clamp(sampler.borderColor.getAccess<deInt32>()[(int)map], valueMin[(int)map], valueMax[(int)map]);
		}
	}

	return result;
}